

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<float,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<float,_true> *ret)

{
  undefined6 in_register_00000032;
  _Vector_base<float,_std::allocator<float>_> local_30;
  
  (**(code **)(*(long *)this + 0x10))(this,CONCAT62(in_register_00000032,field_id));
  Read<duckdb::vector<float,true>>((type *)&local_30,this);
  std::vector<float,_std::allocator<float>_>::_M_move_assign
            (&ret->super_vector<float,_std::allocator<float>_>,&local_30);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_30);
  (**(code **)(*(long *)this + 0x18))(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}